

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall txq::mode(txq *this,context *ctx,token *token,opcode *op)

{
  ulong uVar1;
  optional<unsigned_long> oVar2;
  token local_48;
  
  oVar2 = find_in_table(token,mode::modes,(string_view)(ZEXT816(0x131b64) << 0x40));
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    fail((token *)this,(char *)token,"invalid mode");
  }
  else {
    uVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload << 0x16;
    if ((op->value & uVar1) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    op->value = op->value | uVar1;
    context::tokenize(&local_48,ctx);
    token->column = local_48.column;
    (token->data).string._M_str = local_48.data.string._M_str;
    token->type = local_48.type;
    token->line = local_48.line;
    token->filename = local_48.filename;
    (token->data).predicate = local_48.data.predicate;
    *(undefined8 *)this = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(mode)
    {
        static const char* modes[]{
            "",
            "TEX_HEADER_DIMENSION",
            "TEX_HEADER_TEXTURE_TYPE",
            "",
            "",
            "TEX_HEADER_SAMPLER_POS",
            nullptr,
        };
        const std::optional<uint64_t> result = find_in_table(token, modes, "");
        if (!result) {
            return fail(token, "invalid mode");
        }
        op.add_bits(*result << 22);

        token = ctx.tokenize();
        return {};
    }